

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O2

void __thiscall
enact::ReferenceExpr::ReferenceExpr
          (ReferenceExpr *this,unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_> *expr,
          Token *oper,optional<enact::Token> *permission,optional<enact::Token> *region)

{
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ReferenceExpr_00124608;
  (this->expr)._M_t.super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl =
       (expr->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
       super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
       super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl;
  (expr->_M_t).super___uniq_ptr_impl<enact::Expr,_std::default_delete<enact::Expr>_>._M_t.
  super__Tuple_impl<0UL,_enact::Expr_*,_std::default_delete<enact::Expr>_>.
  super__Head_base<0UL,_enact::Expr_*,_false>._M_head_impl = (Expr *)0x0;
  Token::Token(&this->oper,oper);
  std::_Optional_base<enact::Token,_false,_false>::_Optional_base
            (&(this->permission).super__Optional_base<enact::Token,_false,_false>,
             &permission->super__Optional_base<enact::Token,_false,_false>);
  std::_Optional_base<enact::Token,_false,_false>::_Optional_base
            (&(this->region).super__Optional_base<enact::Token,_false,_false>,
             &region->super__Optional_base<enact::Token,_false,_false>);
  return;
}

Assistant:

ReferenceExpr(
                std::unique_ptr<Expr> expr,
                Token oper,
                std::optional<Token> permission,
                std::optional<Token> region) :
                expr{std::move(expr)},
                oper{std::move(oper)},
                permission{std::move(permission)},
                region{std::move(region)} {}